

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O3

bool CheckPubKeyEncoding(valtype *vchPubKey,uint flags,SigVersion *sigversion,ScriptError *serror)

{
  byte bVar1;
  long lVar2;
  bool bVar3;
  undefined4 uVar4;
  ulong uVar5;
  undefined4 in_register_00000034;
  undefined4 *in_R8;
  long in_FS_OFFSET;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  if (((ulong)sigversion & 2) == 0) goto LAB_00786d83;
  uVar5 = CONCAT44(in_register_00000034,flags) - (long)vchPubKey;
  if (uVar5 < 0x21) {
LAB_00786dbe:
    uVar4 = 0x1c;
  }
  else {
    bVar1 = *(byte *)&(vchPubKey->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)
                      ._M_impl.super__Vector_impl_data._M_start;
    if (bVar1 - 2 < 2) {
      if (uVar5 != 0x21) goto LAB_00786dbe;
    }
    else if ((bVar1 != 4) || (uVar5 != 0x41)) goto LAB_00786dbe;
LAB_00786d83:
    bVar3 = true;
    if (((int)serror != 1 || -1 < (short)sigversion) ||
       ((CONCAT44(in_register_00000034,flags) - (long)vchPubKey == 0x21 &&
        (((ulong)(vchPubKey->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                 _M_impl.super__Vector_impl_data._M_start & 0xfe) == 2)))) goto LAB_00786dcd;
    uVar4 = 0x2b;
  }
  if (in_R8 != (undefined4 *)0x0) {
    *in_R8 = uVar4;
  }
  bVar3 = false;
LAB_00786dcd:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
    __stack_chk_fail();
  }
  return bVar3;
}

Assistant:

bool static CheckPubKeyEncoding(const valtype &vchPubKey, unsigned int flags, const SigVersion &sigversion, ScriptError* serror) {
    if ((flags & SCRIPT_VERIFY_STRICTENC) != 0 && !IsCompressedOrUncompressedPubKey(vchPubKey)) {
        return set_error(serror, SCRIPT_ERR_PUBKEYTYPE);
    }
    // Only compressed keys are accepted in segwit
    if ((flags & SCRIPT_VERIFY_WITNESS_PUBKEYTYPE) != 0 && sigversion == SigVersion::WITNESS_V0 && !IsCompressedPubKey(vchPubKey)) {
        return set_error(serror, SCRIPT_ERR_WITNESS_PUBKEYTYPE);
    }
    return true;
}